

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# name_constraints_unittest.cc
# Opt level: O0

void __thiscall
bssl::ParseNameConstraints_UnquotedRfc822SanNotMatchingQuotedExcluded_Test::
~ParseNameConstraints_UnquotedRfc822SanNotMatchingQuotedExcluded_Test
          (ParseNameConstraints_UnquotedRfc822SanNotMatchingQuotedExcluded_Test *this)

{
  ~ParseNameConstraints_UnquotedRfc822SanNotMatchingQuotedExcluded_Test
            ((ParseNameConstraints_UnquotedRfc822SanNotMatchingQuotedExcluded_Test *)
             &this[-1].super_ParseNameConstraints.super_TestWithParam<std::tuple<bool>_>.super_Test.
              gtest_flag_saver_);
  return;
}

Assistant:

TEST_P(ParseNameConstraints, UnquotedRfc822SanNotMatchingQuotedExcluded) {
  std::string constraints_der;
  ASSERT_TRUE(LoadTestNameConstraint("rfc822name-excluded-quoted.pem",
                                     &constraints_der));
  CertErrors errors;
  std::unique_ptr<NameConstraints> name_constraints(NameConstraints::Create(
      StringAsBytes(constraints_der), is_critical(), &errors));
  ASSERT_TRUE(name_constraints);

  std::string san_der;
  std::unique_ptr<GeneralNames> san;
  ASSERT_TRUE(
      LoadTestSubjectAltName("san-rfc822name-subdomain.pem", &san, &san_der));
  // The name `foo@subdomain.example.com` should be allowed since it doesn't
  // match an exclude of `"foo"@example.com`, but we don't support quoted
  // address at all so this is not allowed.
  EXPECT_FALSE(
      IsPermittedCert(name_constraints.get(), der::Input(), san.get()));
}